

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_info.cc
# Opt level: O2

void __thiscall
google::protobuf::util::converter::anon_unknown_0::TypeInfoForTypeResolver::~TypeInfoForTypeResolver
          (TypeInfoForTypeResolver *this)

{
  Type *this_00;
  Enum *this_01;
  Type **ppTVar1;
  _Base_ptr p_Var2;
  Enum **ppEVar3;
  
  (this->super_TypeInfo)._vptr_TypeInfo = (_func_int **)&PTR__TypeInfoForTypeResolver_003e4168;
  for (p_Var2 = (this->cached_types_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->cached_types_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(int *)&p_Var2[1]._M_left == 0) {
      ppTVar1 = StatusOr<const_google::protobuf::Type_*>::value
                          ((StatusOr<const_google::protobuf::Type_*> *)&p_Var2[1]._M_left);
      this_00 = *ppTVar1;
      if (this_00 != (Type *)0x0) {
        Type::~Type(this_00);
      }
      operator_delete(this_00);
    }
  }
  for (p_Var2 = (this->cached_enums_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->cached_enums_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if (*(int *)&p_Var2[1]._M_left == 0) {
      ppEVar3 = StatusOr<const_google::protobuf::Enum_*>::value
                          ((StatusOr<const_google::protobuf::Enum_*> *)&p_Var2[1]._M_left);
      this_01 = *ppEVar3;
      if (this_01 != (Enum *)0x0) {
        Enum::~Enum(this_01);
      }
      operator_delete(this_01);
    }
  }
  std::
  _Rb_tree<const_google::protobuf::Type_*,_std::pair<const_google::protobuf::Type_*const,_std::map<google::protobuf::StringPiece,_google::protobuf::StringPiece,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::StringPiece>_>_>_>,_std::_Select1st<std::pair<const_google::protobuf::Type_*const,_std::map<google::protobuf::StringPiece,_google::protobuf::StringPiece,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::StringPiece>_>_>_>_>,_std::less<const_google::protobuf::Type_*>,_std::allocator<std::pair<const_google::protobuf::Type_*const,_std::map<google::protobuf::StringPiece,_google::protobuf::StringPiece,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::StringPiece>_>_>_>_>_>
  ::~_Rb_tree(&(this->indexed_types_)._M_t);
  std::
  _Rb_tree<google::protobuf::StringPiece,_std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>,_std::_Select1st<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Enum_*>_>_>_>
  ::~_Rb_tree(&(this->cached_enums_)._M_t);
  std::
  _Rb_tree<google::protobuf::StringPiece,_std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Type_*>_>,_std::_Select1st<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Type_*>_>_>,_std::less<google::protobuf::StringPiece>,_std::allocator<std::pair<const_google::protobuf::StringPiece,_google::protobuf::util::StatusOr<const_google::protobuf::Type_*>_>_>_>
  ::~_Rb_tree(&(this->cached_types_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->string_storage_)._M_t);
  return;
}

Assistant:

virtual ~TypeInfoForTypeResolver() {
    DeleteCachedTypes(&cached_types_);
    DeleteCachedTypes(&cached_enums_);
  }